

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O0

void pwm_chn_w(void *info,UINT8 Channel,UINT16 data)

{
  pwm_chip *chip;
  UINT16 data_local;
  UINT8 Channel_local;
  void *info_local;
  
  switch(Channel) {
  case '\0':
    PWM_Set_Int((pwm_chip *)info,(UINT8)(data >> 8));
    break;
  case '\x01':
    PWM_Set_Cycle((pwm_chip *)info,data);
    break;
  case '\x02':
    *(UINT16 *)((long)info + 0x10) = data;
    break;
  case '\x03':
    *(UINT16 *)((long)info + 0xe) = data;
    if ((*(char *)((long)info + 0xc) == '\0') &&
       (*(short *)((long)info + 0x10) == *(short *)((long)info + 0xe))) {
      *(uint *)((long)info + 0x14) = (uint)data;
      *(undefined1 *)((long)info + 0xc) = 1;
    }
    break;
  case '\x04':
    *(UINT16 *)((long)info + 0x10) = data;
    *(UINT16 *)((long)info + 0xe) = data;
    if (*(char *)((long)info + 0xc) == '\0') {
      *(uint *)((long)info + 0x14) = (uint)data;
      *(undefined1 *)((long)info + 0xc) = 1;
    }
  }
  return;
}

Assistant:

static void pwm_chn_w(void* info, UINT8 Channel, UINT16 data)
{
	pwm_chip* chip = (pwm_chip*)info;
	
	switch(Channel)
	{
	case 0x00/2:	// control register
		PWM_Set_Int(chip, data >> 8);
		break;
	case 0x02/2:	// cycle register
		PWM_Set_Cycle(chip, data);
		break;
	case 0x04/2:	// l ch
		chip->PWM_Out_L = data;
		break;
	case 0x06/2:	// r ch
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			if (chip->PWM_Out_L == chip->PWM_Out_R)
			{
				// fixes these terrible pops when
				// starting/stopping/pausing the song
				chip->PWM_Offset = data;
				chip->PWM_Mode = 0x01;
			}
		}
		break;
	case 0x08/2:	// mono ch
		chip->PWM_Out_L = data;
		chip->PWM_Out_R = data;
		if (! chip->PWM_Mode)
		{
			chip->PWM_Offset = data;
			chip->PWM_Mode = 0x01;
		}
		break;
	}
	
	return;
}